

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int file_gen_utility_names(archive_write *a,file *file)

{
  char cVar1;
  void *pvVar2;
  char *__dest;
  bool bVar3;
  size_t sVar4;
  wchar_t wVar5;
  mode_t mVar6;
  size_t ll;
  int *piVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  size_t len;
  char *pp;
  size_t len2;
  size_t local_68;
  int local_5c;
  char *local_58;
  archive_string *local_50;
  archive_string *local_48;
  archive_string *local_40;
  size_t local_38;
  
  pvVar2 = a->format_data;
  (file->parentdir).length = 0;
  (file->basename).length = 0;
  (file->symlink).length = 0;
  if (file->parent == file) {
    return 0;
  }
  wVar5 = _archive_entry_pathname_l
                    (file->entry,&local_58,&local_68,*(archive_string_conv **)((long)pvVar2 + 0x118)
                    );
  if (wVar5 == L'\0') {
    local_5c = 0;
  }
  else {
    piVar7 = __errno_location();
    if (*piVar7 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
      return -0x1e;
    }
    pcVar8 = archive_entry_pathname(file->entry);
    archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to UTF-8",pcVar8);
    local_5c = -0x14;
  }
  local_48 = &file->parentdir;
  local_50 = &file->basename;
  local_40 = &file->symlink;
  (file->parentdir).length = 0;
  archive_strncat(local_48,local_58,local_68);
  local_68 = (file->parentdir).length;
  __dest = (file->parentdir).s;
  pcVar8 = __dest;
LAB_0016061d:
  do {
    if (*pcVar8 == '.') {
      cVar1 = pcVar8[1];
      if (cVar1 != '\0') {
        if (cVar1 != '/') {
          if (cVar1 != '.') break;
          if (pcVar8[2] == '/') {
            pcVar8 = pcVar8 + 3;
            local_68 = local_68 - 3;
            goto LAB_0016061d;
          }
          if (pcVar8[2] != '\0') break;
        }
        pcVar8 = pcVar8 + 2;
        local_68 = local_68 - 2;
        goto LAB_0016061d;
      }
    }
    else if (*pcVar8 != '/') break;
    pcVar8 = pcVar8 + 1;
    local_68 = local_68 - 1;
  } while( true );
  if (pcVar8 != __dest) {
    memmove(__dest,pcVar8,local_68 + 1);
    pcVar8 = __dest;
  }
  do {
    sVar4 = local_68;
    if (local_68 == 0) break;
    if (pcVar8[local_68 - 1] == '/') {
      pcVar8[local_68 - 1] = '\0';
      local_68 = local_68 - 1;
    }
    if (((1 < local_68) && (pcVar8[local_68 - 2] == '/')) && (pcVar8[local_68 - 1] == '.')) {
      pcVar8[local_68 - 2] = '\0';
      local_68 = local_68 - 2;
    }
    if (((2 < local_68) && (pcVar8[local_68 - 3] == '/')) &&
       ((pcVar8[local_68 - 2] == '.' && (pcVar8[local_68 - 1] == '.')))) {
      pcVar8[local_68 - 3] = '\0';
      local_68 = local_68 - 3;
    }
  } while (sVar4 != local_68);
LAB_001607ae:
  pcVar10 = pcVar8;
  if (*pcVar10 == '/') {
    pcVar8 = pcVar10 + 1;
    if (pcVar10[1] == '.') {
      if (pcVar10[2] == '/') {
        pcVar8 = pcVar10 + 2;
        goto LAB_00160741;
      }
      if ((pcVar10[2] == '.') && (pcVar10[3] == '/')) {
        pcVar8 = pcVar10;
        do {
          pcVar8 = pcVar8 + -1;
          if (pcVar8 < __dest) break;
        } while (*pcVar8 != '/');
        if (__dest < pcVar8) {
          strcpy(pcVar8,pcVar10 + 3);
        }
        else {
          strcpy(__dest,pcVar10 + 4);
          pcVar8 = __dest;
        }
      }
    }
    else if (pcVar10[1] == '/') {
LAB_00160741:
      sVar9 = strlen(pcVar8);
      memmove(pcVar10,pcVar8,sVar9 + 1);
      pcVar8 = pcVar10;
    }
    goto LAB_001607ae;
  }
  if (*pcVar10 != '\0') {
    pcVar8 = pcVar10 + 1;
    goto LAB_001607ae;
  }
  local_68 = strlen(__dest);
  mVar6 = archive_entry_filetype(file->entry);
  iVar12 = local_5c;
  if (mVar6 != 0xa000) goto LAB_0016088f;
  wVar5 = _archive_entry_symlink_l
                    (file->entry,&local_58,&local_38,*(archive_string_conv **)((long)pvVar2 + 0x118)
                    );
  iVar12 = local_5c;
  if (wVar5 == L'\0') {
LAB_0016085f:
    (file->symlink).length = 0;
    archive_strncat(local_40,local_58,local_38);
    bVar3 = true;
  }
  else {
    piVar7 = __errno_location();
    if (*piVar7 != 0xc) {
      pcVar8 = archive_entry_symlink(file->entry);
      archive_set_error(&a->archive,0x54,"Can\'t translate symlink \'%s\' to UTF-8",pcVar8);
      iVar12 = -0x14;
      goto LAB_0016085f;
    }
    bVar3 = false;
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
    iVar12 = local_5c;
  }
  if (!bVar3) {
    return -0x1e;
  }
LAB_0016088f:
  pcVar10 = (char *)0x0;
  for (pcVar8 = __dest; (pcVar11 = pcVar8, *pcVar8 == '/' || (pcVar11 = pcVar10, *pcVar8 != '\0'));
      pcVar8 = pcVar8 + 1) {
    pcVar10 = pcVar11;
  }
  if (pcVar10 == (char *)0x0) {
    (file->parentdir).length = local_68;
    (file->basename).length = 0;
    archive_string_concat(local_50,local_48);
    (file->parentdir).length = 0;
    *(file->parentdir).s = '\0';
  }
  else {
    *pcVar10 = '\0';
    (file->parentdir).length = (long)pcVar10 - (long)__dest;
    (file->basename).length = 0;
    sVar9 = strlen(pcVar10 + 1);
    archive_strncat(local_50,pcVar10 + 1,sVar9);
  }
  return iVar12;
}

Assistant:

static int
file_gen_utility_names(struct archive_write *a, struct file *file)
{
	struct xar *xar;
	const char *pp;
	char *p, *dirname, *slash;
	size_t len;
	int r = ARCHIVE_OK;

	xar = (struct xar *)a->format_data;
	archive_string_empty(&(file->parentdir));
	archive_string_empty(&(file->basename));
	archive_string_empty(&(file->symlink));

	if (file->parent == file)/* virtual root */
		return (ARCHIVE_OK);

	if (archive_entry_pathname_l(file->entry, &pp, &len, xar->sconv)
	    != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to UTF-8",
		    archive_entry_pathname(file->entry));
		r = ARCHIVE_WARN;
	}
	archive_strncpy(&(file->parentdir), pp, len);
	len = file->parentdir.length;
	p = dirname = file->parentdir.s;
	/*
	 * Convert a path-separator from '\' to  '/'
	 */
	cleanup_backslash(p, len);

	/*
	 * Remove leading '/', '../' and './' elements
	 */
	while (*p) {
		if (p[0] == '/') {
			p++;
			len--;
		} else if (p[0] != '.')
			break;
		else if (p[1] == '.' && p[2] == '/') {
			p += 3;
			len -= 3;
		} else if (p[1] == '/' || (p[1] == '.' && p[2] == '\0')) {
			p += 2;
			len -= 2;
		} else if (p[1] == '\0') {
			p++;
			len--;
		} else
			break;
	}
	if (p != dirname) {
		memmove(dirname, p, len+1);
		p = dirname;
	}
	/*
	 * Remove "/","/." and "/.." elements from tail.
	 */
	while (len > 0) {
		size_t ll = len;

		if (p[len-1] == '/') {
			p[len-1] = '\0';
			len--;
		}
		if (len > 1 && p[len-2] == '/' && p[len-1] == '.') {
			p[len-2] = '\0';
			len -= 2;
		}
		if (len > 2 && p[len-3] == '/' && p[len-2] == '.' &&
		    p[len-1] == '.') {
			p[len-3] = '\0';
			len -= 3;
		}
		if (ll == len)
			break;
	}
	while (*p) {
		if (p[0] == '/') {
			if (p[1] == '/')
				/* Convert '//' --> '/' */
				memmove(p, p+1, strlen(p+1) + 1);
			else if (p[1] == '.' && p[2] == '/')
				/* Convert '/./' --> '/' */
				memmove(p, p+2, strlen(p+2) + 1);
			else if (p[1] == '.' && p[2] == '.' && p[3] == '/') {
				/* Convert 'dir/dir1/../dir2/'
				 *     --> 'dir/dir2/'
				 */
				char *rp = p -1;
				while (rp >= dirname) {
					if (*rp == '/')
						break;
					--rp;
				}
				if (rp > dirname) {
					strcpy(rp, p+3);
					p = rp;
				} else {
					strcpy(dirname, p+4);
					p = dirname;
				}
			} else
				p++;
		} else
			p++;
	}
	p = dirname;
	len = strlen(p);

	if (archive_entry_filetype(file->entry) == AE_IFLNK) {
		size_t len2;
		/* Convert symlink name too. */
		if (archive_entry_symlink_l(file->entry, &pp, &len2,
		    xar->sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate symlink '%s' to UTF-8",
			    archive_entry_symlink(file->entry));
			r = ARCHIVE_WARN;
		}
		archive_strncpy(&(file->symlink), pp, len2);
		cleanup_backslash(file->symlink.s, file->symlink.length);
	}
	/*
	 * - Count up directory elements.
	 * - Find out the position which points the last position of
	 *   path separator('/').
	 */
	slash = NULL;
	for (; *p != '\0'; p++)
		if (*p == '/')
			slash = p;
	if (slash == NULL) {
		/* The pathname doesn't have a parent directory. */
		file->parentdir.length = len;
		archive_string_copy(&(file->basename), &(file->parentdir));
		archive_string_empty(&(file->parentdir));
		*file->parentdir.s = '\0';
		return (r);
	}

	/* Make a basename from dirname and slash */
	*slash  = '\0';
	file->parentdir.length = slash - dirname;
	archive_strcpy(&(file->basename),  slash + 1);
	return (r);
}